

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidatePushCData(xmlRelaxNGValidCtxtPtr ctxt,xmlChar *data,int len)

{
  int iVar1;
  int ret;
  int len_local;
  xmlChar *data_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (ctxt->elem == (xmlRegExecCtxtPtr)0x0)) ||
     (_ret = data, data == (xmlChar *)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    for (; (*_ret != 0 && (((*_ret == 0x20 || ((8 < *_ret && (*_ret < 0xb)))) || (*_ret == 0xd))));
        _ret = _ret + 1) {
    }
    if (*_ret == 0) {
      ctxt_local._4_4_ = 1;
    }
    else {
      iVar1 = xmlRegExecPushString(ctxt->elem,(xmlChar *)"#text",ctxt);
      if (iVar1 < 0) {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TEXTWRONG,(xmlChar *)" TODO ",(xmlChar *)0x0,0)
        ;
        ctxt_local._4_4_ = -1;
      }
      else {
        ctxt_local._4_4_ = 1;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlRelaxNGValidatePushCData(xmlRelaxNGValidCtxtPtr ctxt,
                            const xmlChar * data, int len ATTRIBUTE_UNUSED)
{
    int ret = 1;

    if ((ctxt == NULL) || (ctxt->elem == NULL) || (data == NULL))
        return (-1);

#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "CDATA %s %d\n", data, len);
#endif

    while (*data != 0) {
        if (!IS_BLANK_CH(*data))
            break;
        data++;
    }
    if (*data == 0)
        return (1);

    ret = xmlRegExecPushString(ctxt->elem, BAD_CAST "#text", ctxt);
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_TEXTWRONG, BAD_CAST " TODO ");
#ifdef DEBUG_PROGRESSIVE
        xmlGenericError(xmlGenericErrorContext, "CDATA failed\n");
#endif

        return (-1);
    }
    return (1);
}